

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateStringLiteral(ExpressionEvalContext *ctx,ExprStringLiteral *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  _func_int **pp_Var3;
  SynBase *pSVar4;
  TypeBase *pTVar5;
  int iVar6;
  undefined4 extraout_var;
  ExprBase *pEVar7;
  
  pAVar2 = ctx->ctx->allocator;
  iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x40);
  pEVar7 = (ExprBase *)CONCAT44(extraout_var,iVar6);
  pSVar4 = (expression->super_ExprBase).source;
  pTVar5 = (expression->super_ExprBase).type;
  pp_Var3 = (_func_int **)expression->value;
  uVar1 = expression->length;
  pEVar7->typeID = 5;
  pEVar7->source = pSVar4;
  pEVar7->type = pTVar5;
  pEVar7->next = (ExprBase *)0x0;
  pEVar7->listed = false;
  pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002296d0;
  pEVar7[1]._vptr_ExprBase = pp_Var3;
  pEVar7[1].typeID = uVar1;
  pEVar7 = CheckType(&expression->super_ExprBase,pEVar7);
  return pEVar7;
}

Assistant:

ExprBase* EvaluateStringLiteral(ExpressionEvalContext &ctx, ExprStringLiteral *expression)
{
	return CheckType(expression, new (ctx.ctx.get<ExprStringLiteral>()) ExprStringLiteral(expression->source, expression->type, expression->value, expression->length));
}